

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

int Gia_ManFactorNode(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  int iVar1;
  int iVar2;
  Dec_Graph_t *pFForm_00;
  int Lit;
  Dec_Graph_t *pFForm;
  Vec_Int_t *vLeaves_local;
  char *pSop_local;
  Gia_Man_t *p_local;
  
  iVar1 = Kit_PlaGetVarNum(pSop);
  if (iVar1 == 0) {
    iVar1 = Kit_PlaIsConst0(pSop);
    p_local._4_4_ = Abc_LitNotCond(1,iVar1);
  }
  else {
    iVar1 = Kit_PlaGetVarNum(pSop);
    iVar2 = Vec_IntSize(vLeaves);
    if (iVar1 != iVar2) {
      __assert_fail("Kit_PlaGetVarNum(pSop) == Vec_IntSize(vLeaves)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x75,"int Gia_ManFactorNode(Gia_Man_t *, char *, Vec_Int_t *)");
    }
    iVar1 = Kit_PlaGetVarNum(pSop);
    if ((2 < iVar1) && (iVar1 = Kit_PlaGetCubeNum(pSop), 1 < iVar1)) {
      pFForm_00 = Dec_Factor(pSop);
      iVar1 = Gia_ManFactorGraph(p,pFForm_00,vLeaves);
      Dec_GraphFree(pFForm_00);
      return iVar1;
    }
    p_local._4_4_ = Gia_ManSopToAig(p,pSop,vLeaves);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManFactorNode( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    if ( Kit_PlaGetVarNum(pSop) == 0 )
        return Abc_LitNotCond( 1, Kit_PlaIsConst0(pSop) );
    assert( Kit_PlaGetVarNum(pSop) == Vec_IntSize(vLeaves) );
    if ( Kit_PlaGetVarNum(pSop) > 2 && Kit_PlaGetCubeNum(pSop) > 1 )
    {
        Dec_Graph_t * pFForm = Dec_Factor( pSop );
        int Lit = Gia_ManFactorGraph( p, pFForm, vLeaves );
        Dec_GraphFree( pFForm );
        return Lit;
    }
    return Gia_ManSopToAig( p, pSop, vLeaves );
}